

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

char * upb_MtDataEncoder_PutField
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType type,uint32_t field_num,
                 uint64_t field_mod)

{
  char ch;
  char cVar1;
  char *pcVar2;
  uint uVar3;
  
  *(char **)e->internal = ptr;
  uVar3 = *(uint *)(e->internal + 0x10);
  if (uVar3 <= field_num && field_num - uVar3 != 0) {
    if (uVar3 + 1 == field_num) {
      *(uint32_t *)(e->internal + 0x10) = field_num;
      if (ptr == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      ptr = upb_MtDataEncoder_PutBase92Varint(e,ptr,field_num - uVar3,0x5f,0x7e);
      if (ptr == (char *)0x0) {
        return (char *)0x0;
      }
      *(uint32_t *)(e->internal + 0x10) = field_num;
    }
    if ((field_mod & 4) == 0) {
      cVar1 = _upb_MtDataEncoder_PutFieldType_kUpb_TypeToEncoded[type];
    }
    else {
      cVar1 = '\x12';
      if (type != kUpb_FieldType_Enum) {
        __assert_fail("type == kUpb_FieldType_Enum",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                      ,0xb8,
                      "char *_upb_MtDataEncoder_PutFieldType(upb_MtDataEncoder *, char *, upb_FieldType, uint64_t)"
                     );
      }
    }
    ch = cVar1 + '\x14';
    if ((field_mod & 1) == 0) {
      ch = cVar1;
    }
    pcVar2 = upb_MtDataEncoder_Put(e,ptr,ch);
    if (pcVar2 != (char *)0x0) {
      uVar3 = 0;
      if (((field_mod & 1) != 0) &&
         (uVar3 = 0,
         (0xffffe1ffU >> (type & (kUpb_FieldType_SFixed64|kUpb_FieldType_SFixed32)) & 1) != 0)) {
        uVar3 = (*(uint *)(e->internal + 8) ^ (uint)field_mod) >> 1 & 1;
      }
      if ((type == kUpb_FieldType_String) &&
         (((uint)(field_mod >> 5) & 1) != ((uint)*(ulong *)(e->internal + 8) & 1))) {
        if ((*(ulong *)(e->internal + 8) & 1) != 0) {
          __assert_fail("!message_validates_utf8",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                        ,0xdc,
                        "char *_upb_MtDataEncoder_MaybePutModifiers(upb_MtDataEncoder *, char *, upb_FieldType, uint64_t)"
                       );
        }
        uVar3 = uVar3 | 8;
      }
      pcVar2 = upb_MtDataEncoder_PutModifier
                         (e,pcVar2,(ulong)((uint)field_mod >> 3 & 2 |
                                          (uint)(field_mod >> 1) & 4 | uVar3));
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char* upb_MtDataEncoder_PutField(upb_MtDataEncoder* e, char* ptr,
                                 upb_FieldType type, uint32_t field_num,
                                 uint64_t field_mod) {
  upb_MtDataEncoder_GetInternal(e, ptr);

  ptr = _upb_MtDataEncoder_MaybePutFieldSkip(e, ptr, field_num);
  if (!ptr) return NULL;

  ptr = _upb_MtDataEncoder_PutFieldType(e, ptr, type, field_mod);
  if (!ptr) return NULL;

  return _upb_MtDataEncoder_MaybePutModifiers(e, ptr, type, field_mod);
}